

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

int mpc_parse_run(mpc_input_t *i,mpc_parser_t *p,mpc_result_t *r,mpc_err_t **e,int depth)

{
  mpc_apply_t p_Var1;
  mpc_ctor_t p_Var2;
  long lVar3;
  char *pcVar4;
  char **ppcVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  char cVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  mpc_err_t *pmVar12;
  mpc_input_t *pmVar13;
  mpc_result_t mVar14;
  mpc_result_t *pmVar15;
  mpc_result_t mVar16;
  undefined4 extraout_var_00;
  mpc_val_t *pmVar17;
  uint uVar18;
  size_t j;
  ulong uVar19;
  long lVar20;
  char *pcVar21;
  mpc_input_t *pmVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  mpc_result_t results_stk [4];
  mpc_result_t *local_80;
  uint local_60;
  mpc_result_t local_58;
  mpc_result_t mStack_50;
  mpc_result_t local_48;
  mpc_result_t mStack_40;
  undefined4 extraout_var;
  
  if (depth == 1000) {
    pcVar21 = "Maximum recursion depth exceeded!";
    goto LAB_00101ed9;
  }
  switch(p->type) {
  case '\0':
    pcVar21 = "Parser Undefined!";
    goto LAB_00101ed9;
  case '\x01':
    goto switchD_00101f1d_caseD_1;
  case '\x02':
    pcVar21 = (char *)(p->data).lift.lf;
    goto LAB_00101ed9;
  case '\x03':
    mVar14.output = (*(p->data).lift.lf)();
    goto LAB_00102786;
  case '\x04':
    mVar14 = (mpc_result_t)(p->data).lift.x;
    goto LAB_00102786;
  case '\x05':
    i->suppress = i->suppress + 1;
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    i->suppress = i->suppress + -1;
    if (iVar11 != 0) {
      return 1;
    }
    pcVar21 = (p->data).expect.m;
    goto LAB_00102476;
  case '\x06':
    p_Var2 = (p->data).lift.lf;
    r->error = (mpc_err_t *)0x0;
    cVar9 = i->last;
    cVar8 = mpc_input_peekc(i);
    pmVar17 = (*p_Var2)((ulong)(uint)(int)cVar9,(ulong)(uint)(int)cVar8);
    iVar11 = (int)pmVar17;
    break;
  case '\a':
    mVar14.output = mpc_malloc(i,0x20);
    lVar20 = (i->state).row;
    lVar25 = (i->state).col;
    iVar11 = (i->state).term;
    uVar6 = *(undefined4 *)&(i->state).field_0x1c;
    ((mVar14.error)->state).pos = (i->state).pos;
    ((mVar14.error)->state).row = lVar20;
    ((mVar14.error)->state).col = lVar25;
    ((mpc_state_t *)mVar14)->term = iVar11;
    *(undefined4 *)&((mpc_state_t *)mVar14)->field_0x1c = uVar6;
LAB_00102786:
    *r = mVar14;
    return 1;
  case '\b':
    iVar11 = mpc_input_any(i,(char **)&r->error);
    break;
  case '\t':
    iVar11 = mpc_input_char(i,(p->data).range.x,(char **)&r->error);
    break;
  case '\n':
    iVar11 = mpc_input_oneof(i,(char *)(p->data).lift.lf,(char **)&r->error);
    break;
  case '\v':
    iVar11 = mpc_input_noneof(i,(char *)(p->data).lift.lf,(char **)&r->error);
    break;
  case '\f':
    iVar11 = mpc_input_range(i,(p->data).range.x,(p->data).range.y,(char **)&r->error);
    break;
  case '\r':
    iVar11 = mpc_input_satisfy(i,(_func_int_char *)(p->data).lift.lf,(char **)&r->error);
    break;
  case '\x0e':
    iVar11 = mpc_input_string(i,(char *)(p->data).lift.lf,(char **)&r->error);
    break;
  case '\x0f':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 != 0) {
      mVar14.output = mpc_parse_apply(i,(p->data).apply.f,r->output);
      goto LAB_00102786;
    }
    goto LAB_00101ee5;
  case '\x10':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 != 0) {
      p_Var1 = (p->data).apply.f;
      pmVar22 = (mpc_input_t *)r->error;
      pmVar13 = pmVar22;
      if (pmVar22 < i + 1 && i->mem <= pmVar22) {
        pmVar13 = (mpc_input_t *)malloc(0x40);
        uVar6 = *(undefined4 *)&pmVar22->field_0x4;
        pcVar21 = pmVar22->filename;
        lVar20 = (pmVar22->state).pos;
        lVar25 = (pmVar22->state).row;
        lVar3 = (pmVar22->state).col;
        iVar11 = (pmVar22->state).term;
        uVar7 = *(undefined4 *)&(pmVar22->state).field_0x1c;
        pcVar4 = pmVar22->string;
        ppcVar5 = (char **)pmVar22->buffer;
        pmVar13->type = pmVar22->type;
        *(undefined4 *)&pmVar13->field_0x4 = uVar6;
        pmVar13->filename = pcVar21;
        (pmVar13->state).pos = lVar20;
        (pmVar13->state).row = lVar25;
        (pmVar13->state).col = lVar3;
        (pmVar13->state).term = iVar11;
        *(undefined4 *)&(pmVar13->state).field_0x1c = uVar7;
        pmVar13->string = pcVar4;
        pmVar13->buffer = (char *)ppcVar5;
        i->mem_full[(ulong)((long)pmVar22 - (long)i->mem) >> 6] = '\0';
      }
      pmVar17 = (*p_Var1)(pmVar13);
      r->output = pmVar17;
      return 1;
    }
    goto LAB_00101ee5;
  case '\x11':
    i->backtrack = i->backtrack + -1;
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    i->backtrack = i->backtrack + 1;
    return iVar11;
  case '\x12':
    mpc_input_mark(i);
    i->suppress = i->suppress + 1;
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 == 0) {
      pmVar22 = i;
      mpc_input_unmark(i);
      i->suppress = i->suppress + -1;
      mVar14._0_4_ = (*(p->data).check.f)((mpc_val_t **)pmVar22);
      mVar14._4_4_ = extraout_var_00;
      goto LAB_00102786;
    }
    mpc_input_rewind(i);
    i->suppress = i->suppress + -1;
    mpc_parse_dtor(i,(p->data).check.dx,r->output);
    pcVar21 = "opposite";
LAB_00102476:
    pmVar12 = mpc_err_new(i,pcVar21);
    goto LAB_00101ee1;
  case '\x13':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 == 0) {
      pmVar12 = mpc_err_merge(i,*e,r->error);
      *e = pmVar12;
      mVar16._0_4_ = (*(p->data).check.f)((mpc_val_t **)i);
      mVar16._4_4_ = extraout_var;
      *r = mVar16;
      return 1;
    }
    return 1;
  case '\x14':
    pmVar15 = &local_58;
    iVar11 = mpc_parse_run(i,(p->data).repeat.x,pmVar15,e,depth + 1);
    if (iVar11 == 0) {
      uVar18 = 0;
      local_80 = pmVar15;
    }
    else {
      local_80 = &local_58;
      local_60 = 4;
      lVar25 = 0;
      lVar20 = 8;
      uVar24 = 1;
      iVar11 = 0;
      do {
        if (uVar24 == 4) {
          local_80 = (mpc_result_t *)mpc_malloc(i,0x30);
          local_80->error = (mpc_err_t *)local_58;
          local_80[1] = mStack_50;
          local_80[2] = local_48;
          local_80[3] = mStack_40;
          local_60 = 6;
        }
        else if ((long)(int)local_60 <= (long)uVar24) {
          local_60 = ((uint)(uVar24 >> 1) & 0x7fffffff) + (int)uVar24;
          local_80 = (mpc_result_t *)mpc_realloc(i,local_80,(ulong)local_60 << 3);
        }
        iVar10 = mpc_parse_run(i,(p->data).repeat.x,(mpc_result_t *)((long)local_80 + lVar20),e,
                               depth + 1);
        iVar11 = iVar11 + -1;
        lVar25 = lVar25 + -8;
        lVar20 = lVar20 + 8;
        uVar24 = uVar24 + 1;
      } while (iVar10 != 0);
      uVar18 = -iVar11;
      pmVar15 = (mpc_result_t *)((long)local_80 - lVar25);
    }
    pmVar12 = mpc_err_merge(i,*e,pmVar15->error);
    *e = pmVar12;
    pmVar17 = mpc_parse_fold(i,(p->data).repeat.f,uVar18,&local_80->output);
    r->output = pmVar17;
    iVar11 = 1;
    if (uVar18 < 4) {
      return 1;
    }
    if (local_80 < (mpc_result_t *)(i + 1) && i->mem <= local_80) {
      i->mem_full[(ulong)((long)local_80 - (long)i->mem) >> 6] = '\0';
      return 1;
    }
    goto LAB_001029aa;
  case '\x15':
    local_80 = &local_58;
    iVar11 = mpc_parse_run(i,(p->data).repeat.x,local_80,e,depth + 1);
    if (iVar11 != 0) {
      uVar26 = 4;
      lVar20 = 8;
      uVar24 = 1;
      do {
        uVar19 = uVar24;
        if (uVar19 == 4) {
          local_80 = (mpc_result_t *)mpc_malloc(i,0x30);
          local_80->error = (mpc_err_t *)local_58;
          local_80[1] = mStack_50;
          local_80[2] = local_48;
          local_80[3] = mStack_40;
          uVar26 = 6;
        }
        else if ((long)(int)uVar26 <= (long)uVar19) {
          uVar26 = (ulong)(((uint)(uVar19 >> 1) & 0x7fffffff) + (int)uVar19);
          local_80 = (mpc_result_t *)mpc_realloc(i,local_80,uVar26 * 8);
        }
        iVar11 = mpc_parse_run(i,(p->data).repeat.x,(mpc_result_t *)(lVar20 + (long)local_80),e,
                               depth + 1);
        lVar20 = lVar20 + 8;
        uVar24 = uVar19 + 1;
      } while (iVar11 != 0);
      pmVar12 = mpc_err_merge(i,*e,local_80[uVar19].error);
      *e = pmVar12;
      pmVar17 = mpc_parse_fold(i,(p->data).repeat.f,(int)uVar19,&local_80->output);
      r->output = pmVar17;
      iVar11 = 1;
      if (uVar19 - 1 < 3) {
        return 1;
      }
      if (local_80 < (mpc_result_t *)(i + 1) && i->mem <= local_80) {
        i->mem_full[(ulong)((long)local_80 - (long)i->mem) >> 6] = '\0';
        return 1;
      }
      goto LAB_001029aa;
    }
    pmVar12 = mpc_err_repeat(i,local_58.error,"one or more of ");
    goto LAB_00101ee1;
  case '\x16':
    lVar20 = (long)(p->data).repeat.n;
    if (lVar20 < 5) {
      local_80 = &local_58;
    }
    else {
      local_80 = (mpc_result_t *)mpc_malloc(i,lVar20 << 3);
    }
    uVar24 = 0;
    pmVar15 = local_80;
    do {
      iVar11 = mpc_parse_run(i,(p->data).repeat.x,pmVar15,e,depth + 1);
      uVar18 = (p->data).repeat.n;
      if (iVar11 == 0) break;
      uVar24 = uVar24 + 1;
      pmVar15 = pmVar15 + 1;
    } while (uVar24 != uVar18);
    uVar23 = (uint)uVar24;
    if (uVar18 != uVar23) {
      if (0 < (int)uVar23) {
        uVar24 = 0;
        do {
          mpc_parse_dtor(i,(p->data).repeat.dx,local_80[uVar24].output);
          uVar24 = uVar24 + 1;
        } while ((uVar23 & 0x7fffffff) != uVar24);
        uVar18 = (p->data).repeat.n;
      }
      pmVar12 = mpc_err_count(i,local_80[(int)uVar23].error,uVar18);
      r->error = pmVar12;
      iVar11 = 0;
      if ((p->data).repeat.n < 5) {
        return 0;
      }
      if (local_80 < (mpc_result_t *)(i + 1) && i->mem <= local_80) {
LAB_001029b4:
        i->mem_full[(ulong)((long)local_80 - (long)i->mem) >> 6] = '\0';
        return iVar11;
      }
      goto LAB_001029aa;
    }
    pmVar17 = mpc_parse_fold(i,(p->data).repeat.f,uVar18,&local_80->output);
    r->output = pmVar17;
    goto LAB_001028a7;
  case '\x17':
    uVar18 = (p->data).repeat.n;
    if ((ulong)uVar18 != 0) {
      if ((int)uVar18 < 5) {
        local_80 = &local_58;
      }
      else {
        local_80 = (mpc_result_t *)mpc_malloc(i,(ulong)uVar18 << 3);
        uVar18 = (p->data).repeat.n;
      }
      if (0 < (int)uVar18) {
        lVar20 = 0;
        pmVar15 = local_80;
        do {
          iVar11 = mpc_parse_run(i,*(mpc_parser_t **)((long)(p->data).lift.x + lVar20 * 8),pmVar15,e
                                 ,depth + 1);
          if (iVar11 != 0) {
            r->error = (mpc_err_t *)*(mpc_err_t **)pmVar15;
            iVar11 = 1;
            goto LAB_0010297a;
          }
          pmVar12 = mpc_err_merge(i,*e,pmVar15->error);
          *e = pmVar12;
          lVar20 = lVar20 + 1;
          pmVar15 = pmVar15 + 1;
        } while (lVar20 < (p->data).repeat.n);
      }
      r->error = (mpc_err_t *)0x0;
      iVar11 = 0;
LAB_0010297a:
      if ((p->data).repeat.n < 5) {
        return iVar11;
      }
      if (local_80 < (mpc_result_t *)(i + 1) && i->mem <= local_80) goto LAB_001029b4;
      goto LAB_001029aa;
    }
    goto switchD_00101f1d_caseD_1;
  case '\x18':
    uVar18 = (p->data).repeat.n;
    if ((ulong)uVar18 == 0) goto switchD_00101f1d_caseD_1;
    if ((int)uVar18 < 5) {
      local_80 = &local_58;
    }
    else {
      local_80 = (mpc_result_t *)mpc_malloc(i,(ulong)uVar18 << 3);
    }
    mpc_input_mark(i);
    if ((p->data).repeat.n < 1) {
      lVar20 = 0;
    }
    else {
      lVar20 = 0;
      do {
        iVar11 = mpc_parse_run(i,*(mpc_parser_t **)((long)(p->data).apply_to.d + lVar20 * 8),
                               local_80 + lVar20,e,depth + 1);
        if (iVar11 == 0) {
          mpc_input_rewind(i);
          if (lVar20 != 0) {
            lVar25 = 0;
            do {
              mpc_parse_dtor(i,*(mpc_dtor_t *)((p->data).check.e + lVar25 * 8),
                             local_80[lVar25].output);
              lVar25 = lVar25 + 1;
            } while (lVar20 != lVar25);
          }
          *r = local_80[lVar20];
          iVar11 = 0;
          if ((p->data).repeat.n < 5) {
            return 0;
          }
          if (local_80 < (mpc_result_t *)(i + 1) && i->mem <= local_80) {
            i->mem_full[(ulong)((long)local_80 - (long)i->mem) >> 6] = '\0';
            return 0;
          }
          goto LAB_001029aa;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < (p->data).repeat.n);
    }
    mpc_input_unmark(i);
    pmVar17 = mpc_parse_fold(i,(p->data).repeat.f,(int)lVar20,&local_80->output);
    r->output = pmVar17;
LAB_001028a7:
    iVar11 = 1;
    if ((p->data).repeat.n < 5) {
      return 1;
    }
    if (local_80 < (mpc_result_t *)(i + 1) && i->mem <= local_80) {
      i->mem_full[(ulong)((long)local_80 - (long)i->mem) >> 6] = '\0';
      return 1;
    }
LAB_001029aa:
    free(local_80);
    return iVar11;
  case '\x19':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 == 0) {
      return 0;
    }
    iVar11 = (*(p->data).check.f)(&r->output);
    if (iVar11 != 0) {
      return 1;
    }
    mpc_parse_dtor(i,(p->data).check.dx,r->output);
    pcVar21 = (p->data).check.e;
    goto LAB_00101ed9;
  case '\x1a':
    iVar11 = mpc_parse_run(i,(p->data).expect.x,r,e,depth + 1);
    if (iVar11 == 0) {
      return 0;
    }
    iVar11 = (*(p->data).check.f)(&r->output);
    if (iVar11 != 0) {
      return 1;
    }
    mpc_parse_dtor(i,(p->data).check.dx,r->output);
    pcVar21 = (p->data).check_with.e;
    goto LAB_00101ed9;
  case '\x1b':
    cVar9 = i->last;
    r->error = (mpc_err_t *)0x0;
    return (uint)(cVar9 == '\0');
  case '\x1c':
    r->error = (mpc_err_t *)0x0;
    if (((i->state).term == 0) && (cVar9 = mpc_input_peekc(i), cVar9 == '\0')) {
      (i->state).term = 1;
      return 1;
    }
    goto LAB_001024ac;
  default:
    pcVar21 = "Unknown Parser Type Id!";
LAB_00101ed9:
    pmVar12 = mpc_err_fail(i,pcVar21);
LAB_00101ee1:
    r->error = pmVar12;
    goto LAB_00101ee5;
  }
  iVar10 = 1;
  if (iVar11 == 0) {
LAB_001024ac:
    r->error = (mpc_err_t *)0x0;
LAB_00101ee5:
    iVar10 = 0;
  }
  return iVar10;
switchD_00101f1d_caseD_1:
  r->error = (mpc_err_t *)0x0;
  return 1;
}

Assistant:

static int mpc_parse_run(mpc_input_t *i, mpc_parser_t *p, mpc_result_t *r, mpc_err_t **e, int depth) {

  int j = 0, k = 0;
  mpc_result_t results_stk[MPC_PARSE_STACK_MIN];
  mpc_result_t *results;
  int results_slots = MPC_PARSE_STACK_MIN;

  if (depth == MPC_MAX_RECURSION_DEPTH)
  {
    MPC_FAILURE(mpc_err_fail(i, "Maximum recursion depth exceeded!"));
  }

  switch (p->type) {

    /* Basic Parsers */

    case MPC_TYPE_ANY:     MPC_PRIMITIVE(mpc_input_any(i, (char**)&r->output));
    case MPC_TYPE_SINGLE:  MPC_PRIMITIVE(mpc_input_char(i, p->data.single.x, (char**)&r->output));
    case MPC_TYPE_RANGE:   MPC_PRIMITIVE(mpc_input_range(i, p->data.range.x, p->data.range.y, (char**)&r->output));
    case MPC_TYPE_ONEOF:   MPC_PRIMITIVE(mpc_input_oneof(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_NONEOF:  MPC_PRIMITIVE(mpc_input_noneof(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_SATISFY: MPC_PRIMITIVE(mpc_input_satisfy(i, p->data.satisfy.f, (char**)&r->output));
    case MPC_TYPE_STRING:  MPC_PRIMITIVE(mpc_input_string(i, p->data.string.x, (char**)&r->output));
    case MPC_TYPE_ANCHOR:  MPC_PRIMITIVE(mpc_input_anchor(i, p->data.anchor.f, (char**)&r->output));
    case MPC_TYPE_SOI:     MPC_PRIMITIVE(mpc_input_soi(i, (char**)&r->output));
    case MPC_TYPE_EOI:     MPC_PRIMITIVE(mpc_input_eoi(i, (char**)&r->output));

    /* Other parsers */

    case MPC_TYPE_UNDEFINED: MPC_FAILURE(mpc_err_fail(i, "Parser Undefined!"));
    case MPC_TYPE_PASS:      MPC_SUCCESS(NULL);
    case MPC_TYPE_FAIL:      MPC_FAILURE(mpc_err_fail(i, p->data.fail.m));
    case MPC_TYPE_LIFT:      MPC_SUCCESS(p->data.lift.lf());
    case MPC_TYPE_LIFT_VAL:  MPC_SUCCESS(p->data.lift.x);
    case MPC_TYPE_STATE:     MPC_SUCCESS(mpc_input_state_copy(i));

    /* Application Parsers */

    case MPC_TYPE_APPLY:
      if (mpc_parse_run(i, p->data.apply.x, r, e, depth+1)) {
        MPC_SUCCESS(mpc_parse_apply(i, p->data.apply.f, r->output));
      } else {
        MPC_FAILURE(r->output);
      }

    case MPC_TYPE_APPLY_TO:
      if (mpc_parse_run(i, p->data.apply_to.x, r, e, depth+1)) {
        MPC_SUCCESS(mpc_parse_apply_to(i, p->data.apply_to.f, r->output, p->data.apply_to.d));
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_CHECK:
      if (mpc_parse_run(i, p->data.check.x, r, e, depth+1)) {
        if (p->data.check.f(&r->output)) {
          MPC_SUCCESS(r->output);
        } else {
          mpc_parse_dtor(i, p->data.check.dx, r->output);
          MPC_FAILURE(mpc_err_fail(i, p->data.check.e));
        }
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_CHECK_WITH:
      if (mpc_parse_run(i, p->data.check_with.x, r, e, depth+1)) {
        if (p->data.check_with.f(&r->output, p->data.check_with.d)) {
          MPC_SUCCESS(r->output);
        } else {
          mpc_parse_dtor(i, p->data.check.dx, r->output);
          MPC_FAILURE(mpc_err_fail(i, p->data.check_with.e));
        }
      } else {
        MPC_FAILURE(r->error);
      }

    case MPC_TYPE_EXPECT:
      mpc_input_suppress_enable(i);
      if (mpc_parse_run(i, p->data.expect.x, r, e, depth+1)) {
        mpc_input_suppress_disable(i);
        MPC_SUCCESS(r->output);
      } else {
        mpc_input_suppress_disable(i);
        MPC_FAILURE(mpc_err_new(i, p->data.expect.m));
      }

    case MPC_TYPE_PREDICT:
      mpc_input_backtrack_disable(i);
      if (mpc_parse_run(i, p->data.predict.x, r, e, depth+1)) {
        mpc_input_backtrack_enable(i);
        MPC_SUCCESS(r->output);
      } else {
        mpc_input_backtrack_enable(i);
        MPC_FAILURE(r->error);
      }

    /* Optional Parsers */

    /* TODO: Update Not Error Message */

    case MPC_TYPE_NOT:
      mpc_input_mark(i);
      mpc_input_suppress_enable(i);
      if (mpc_parse_run(i, p->data.not.x, r, e, depth+1)) {
        mpc_input_rewind(i);
        mpc_input_suppress_disable(i);
        mpc_parse_dtor(i, p->data.not.dx, r->output);
        MPC_FAILURE(mpc_err_new(i, "opposite"));
      } else {
        mpc_input_unmark(i);
        mpc_input_suppress_disable(i);
        MPC_SUCCESS(p->data.not.lf());
      }

    case MPC_TYPE_MAYBE:
      if (mpc_parse_run(i, p->data.not.x, r, e, depth+1)) {
        MPC_SUCCESS(r->output);
      } else {
        *e = mpc_err_merge(i, *e, r->error);
        MPC_SUCCESS(p->data.not.lf());
      }

    /* Repeat Parsers */

    case MPC_TYPE_MANY:

      results = results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == MPC_PARSE_STACK_MIN) {
          results_slots = j + j / 2;
          results = mpc_malloc(i, sizeof(mpc_result_t) * results_slots);
          memcpy(results, results_stk, sizeof(mpc_result_t) * MPC_PARSE_STACK_MIN);
        } else if (j >= results_slots) {
          results_slots = j + j / 2;
          results = mpc_realloc(i, results, sizeof(mpc_result_t) * results_slots);
        }
      }

      *e = mpc_err_merge(i, *e, results[j].error);

      MPC_SUCCESS(
        mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
        if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    case MPC_TYPE_MANY1:

      results = results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == MPC_PARSE_STACK_MIN) {
          results_slots = j + j / 2;
          results = mpc_malloc(i, sizeof(mpc_result_t) * results_slots);
          memcpy(results, results_stk, sizeof(mpc_result_t) * MPC_PARSE_STACK_MIN);
        } else if (j >= results_slots) {
          results_slots = j + j / 2;
          results = mpc_realloc(i, results, sizeof(mpc_result_t) * results_slots);
        }
      }

      if (j == 0) {
        MPC_FAILURE(
          mpc_err_many1(i, results[j].error);
          if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      } else {

        *e = mpc_err_merge(i, *e, results[j].error);

        MPC_SUCCESS(
          mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
          if (j >= MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      }

    case MPC_TYPE_COUNT:

      results = p->data.repeat.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.repeat.n)
        : results_stk;

      while (mpc_parse_run(i, p->data.repeat.x, &results[j], e, depth+1)) {
        j++;
        if (j == p->data.repeat.n) { break; }
      }

      if (j == p->data.repeat.n) {
        MPC_SUCCESS(
          mpc_parse_fold(i, p->data.repeat.f, j, (mpc_val_t**)results);
          if (p->data.repeat.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      } else {
        for (k = 0; k < j; k++) {
          mpc_parse_dtor(i, p->data.repeat.dx, results[k].output);
        }
        MPC_FAILURE(
          mpc_err_count(i, results[j].error, p->data.repeat.n);
          if (p->data.repeat.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
      }

    /* Combinatory Parsers */

    case MPC_TYPE_OR:

      if (p->data.or.n == 0) { MPC_SUCCESS(NULL); }

      results = p->data.or.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.or.n)
        : results_stk;

      for (j = 0; j < p->data.or.n; j++) {
        if (mpc_parse_run(i, p->data.or.xs[j], &results[j], e, depth+1)) {
          MPC_SUCCESS(results[j].output;
            if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
        } else {
          *e = mpc_err_merge(i, *e, results[j].error);
        }
      }

      MPC_FAILURE(NULL;
        if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    case MPC_TYPE_AND:

      if (p->data.and.n == 0) { MPC_SUCCESS(NULL); }

      results = p->data.or.n > MPC_PARSE_STACK_MIN
        ? mpc_malloc(i, sizeof(mpc_result_t) * p->data.or.n)
        : results_stk;

      mpc_input_mark(i);
      for (j = 0; j < p->data.and.n; j++) {
        if (!mpc_parse_run(i, p->data.and.xs[j], &results[j], e, depth+1)) {
          mpc_input_rewind(i);
          for (k = 0; k < j; k++) {
            mpc_parse_dtor(i, p->data.and.dxs[k], results[k].output);
          }
          MPC_FAILURE(results[j].error;
            if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });
        }
      }
      mpc_input_unmark(i);
      MPC_SUCCESS(
        mpc_parse_fold(i, p->data.and.f, j, (mpc_val_t**)results);
        if (p->data.or.n > MPC_PARSE_STACK_MIN) { mpc_free(i, results); });

    /* End */

    default:

      MPC_FAILURE(mpc_err_fail(i, "Unknown Parser Type Id!"));
  }

  return 0;

}